

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportBuildFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *param_3)

{
  long *plVar1;
  cmMakefile *this_00;
  bool bVar2;
  pointer pbVar3;
  string *psVar4;
  ostream *poVar5;
  pointer puVar6;
  pointer puVar7;
  long lVar8;
  ulong uVar9;
  string *psVar10;
  pointer config;
  pointer pbVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view str;
  string_view separator;
  string dest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  ostringstream e;
  string local_2e0;
  string *local_2c0;
  cmGeneratorTarget *local_2b8;
  string local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  cmExportBuildFileGenerator *local_240;
  string *local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_218;
  string local_200;
  undefined1 local_1e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  size_type local_1c8;
  pointer local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  size_type local_198;
  pointer local_190;
  undefined8 local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170 [33];
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  char local_50 [32];
  
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8 = gte;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_258,gte->Makefile,IncludeEmptyConfig);
  local_2c0 = __return_storage_ptr__;
  local_240 = this;
  cmFileSet::CompileDirectoryEntries(&local_218,fileSet);
  local_238 = local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    config = local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      psVar10 = config;
      cmFileSet::EvaluateDirectoryEntries
                (&local_230,fileSet,&local_218,local_2b8->LocalGenerator,config,local_2b8,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      pbVar3 = local_230.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar9 = (long)local_218.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_218.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      puVar6 = local_218.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = local_230.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)uVar9 >> 5) {
        puVar6 = (pointer)((long)&((local_218.
                                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                  _M_head_impl + (uVar9 & 0xffffffffffffffe0));
        lVar8 = ((long)uVar9 >> 5) + 1;
        puVar7 = local_218.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
        do {
          if ((puVar7[-2]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar7 = puVar7 + -2;
            goto LAB_0048e778;
          }
          if ((puVar7[-1]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar7 = puVar7 + -1;
            goto LAB_0048e778;
          }
          if (((puVar7->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) goto LAB_0048e778;
          if ((puVar7[1]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar7 = puVar7 + 1;
            goto LAB_0048e778;
          }
          lVar8 = lVar8 + -1;
          puVar7 = puVar7 + 4;
        } while (1 < lVar8);
        uVar9 = (long)local_218.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6;
      }
      lVar8 = (long)uVar9 >> 3;
      if (lVar8 == 1) {
LAB_0048e755:
        puVar7 = puVar6;
        if (((puVar6->_M_t).
             super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
             .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
            HadContextSensitiveCondition == false) {
          puVar7 = local_218.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
LAB_0048e778:
        if (puVar7 == local_218.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0048e7b6;
        bVar2 = true;
        if (((fileSet->Type)._M_string_length == 0xb) &&
           (plVar1 = (long *)(fileSet->Type)._M_dataplus._M_p,
           *(long *)((long)plVar1 + 3) == 0x53454c55444f4d5f && *plVar1 == 0x55444f4d5f585843)) {
          this_00 = local_240->LG->Makefile;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"The \"",5);
          psVar10 = local_2c0;
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(local_2b8);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1e0,(psVar4->_M_dataplus)._M_p,
                              psVar4->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\" target\'s interface file set \"",0x1f);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(fileSet->Name)._M_dataplus._M_p,
                              (fileSet->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" of type \"",0xb);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(fileSet->Type)._M_dataplus._M_p,
                              (fileSet->Type)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     "\" contains context-sensitive base directory entries which is not supported.",
                     0x4b);
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,
                            (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
          }
          (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
          psVar10->_M_string_length = 0;
          (psVar10->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
          std::ios_base::~ios_base((ios_base *)local_170);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_230);
          goto LAB_0048ea6c;
        }
      }
      else {
        if (lVar8 == 2) {
LAB_0048e745:
          puVar7 = puVar6;
          if (((puVar6->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar6 = puVar6 + 1;
            goto LAB_0048e755;
          }
          goto LAB_0048e778;
        }
        if (lVar8 == 3) {
          puVar7 = puVar6;
          if (((puVar6->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar6 = puVar6 + 1;
            goto LAB_0048e745;
          }
          goto LAB_0048e778;
        }
LAB_0048e7b6:
        bVar2 = false;
      }
      for (; pbVar11 != pbVar3; pbVar11 = pbVar11 + 1) {
        str._M_str = (char *)0x1;
        str._M_len = (size_t)(pbVar11->_M_dataplus)._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_2e0,(cmOutputConverter *)pbVar11->_M_string_length,str,(WrapQuotes)psVar10
                  );
        if ((!bVar2) ||
           ((long)local_258.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_258.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20)) {
          local_2b0._M_dataplus._M_p = (pointer)0x0;
          local_2b0._M_string_length = 1;
          local_2b0.field_2._M_allocated_capacity = (long)&local_2b0.field_2 + 8;
          local_2b0.field_2._M_local_buf[8] = '\"';
          local_1e0._0_8_ = (_func_int **)0x1;
          local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_1c8 = local_2e0._M_string_length;
          local_1c0 = local_2e0._M_dataplus._M_p;
          local_1b8 = 0;
          local_68 = 0;
          local_60 = 1;
          local_1a8 = local_50;
          local_50[0] = '\"';
          local_1b0 = 1;
          local_1a0 = 0;
          views_00._M_len = 3;
          views_00._M_array = (iterator)local_1e0;
          local_1e0._8_8_ = local_2b0.field_2._M_allocated_capacity;
          local_58 = local_1a8;
          cmCatViews(&local_200,views_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278
                     ,&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        local_1e0._0_8_ = (_func_int **)0xc;
        local_1e0._8_8_ = "\"$<$<CONFIG:";
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_1c0 = (config->_M_dataplus)._M_p;
        local_1c8 = config->_M_string_length;
        local_1b8 = 0;
        local_1b0 = 2;
        local_1a8 = ">:";
        local_1a0 = 0;
        local_198 = local_2e0._M_string_length;
        local_190 = local_2e0._M_dataplus._M_p;
        local_188 = 0;
        local_180 = 2;
        local_178 = ">\"";
        local_170[0] = 0;
        views._M_len = 5;
        views._M_array = (iterator)local_1e0;
        cmCatViews(&local_2b0,views);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
                   &local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,
                          (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_230);
      config = config + 1;
    } while (config != local_238);
  }
  psVar10 = local_2c0;
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(local_2c0,&local_278,separator,(string_view)ZEXT816(0));
LAB_0048ea6c:
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  return psVar10;
}

Assistant:

std::string cmExportBuildFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* /*te*/)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    bool const contextSensitive =
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive && type == "CXX_MODULES"_s) {
      auto* mf = this->LG->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base directory entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& directory : directories) {
      auto dest = cmOutputConverter::EscapeForCMake(
        directory, cmOutputConverter::WrapQuotes::NoWrap);

      if (contextSensitive && configs.size() != 1) {
        resultVector.push_back(
          cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
      } else {
        resultVector.emplace_back(cmStrCat('"', dest, '"'));
        break;
      }
    }
  }

  return cmJoin(resultVector, " ");
}